

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

string * google::protobuf::internal::StringTypeHandlerBase::New_abi_cxx11_(void)

{
  string *psVar1;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  return psVar1;
}

Assistant:

string* StringTypeHandlerBase::New() {
  return new string;
}